

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaCheckCOSDerivedOK
              (xmlSchemaAbstractCtxtPtr actxt,xmlSchemaTypePtr type,xmlSchemaTypePtr baseType,
              int set)

{
  int set_local;
  xmlSchemaTypePtr baseType_local;
  xmlSchemaTypePtr type_local;
  xmlSchemaAbstractCtxtPtr actxt_local;
  
  if ((type->type == XML_SCHEMA_TYPE_SIMPLE) ||
     ((type->type == XML_SCHEMA_TYPE_BASIC && (type->builtInType != 0x2d)))) {
    actxt_local._4_4_ = xmlSchemaCheckCOSSTDerivedOK(actxt,type,baseType,set);
  }
  else {
    actxt_local._4_4_ = xmlSchemaCheckCOSCTDerivedOK(actxt,type,baseType,set);
  }
  return actxt_local._4_4_;
}

Assistant:

static int
xmlSchemaCheckCOSDerivedOK(xmlSchemaAbstractCtxtPtr actxt,
			   xmlSchemaTypePtr type,
			   xmlSchemaTypePtr baseType,
			   int set)
{
    if (WXS_IS_SIMPLE(type))
	return (xmlSchemaCheckCOSSTDerivedOK(actxt, type, baseType, set));
    else
	return (xmlSchemaCheckCOSCTDerivedOK(actxt, type, baseType, set));
}